

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,xmlSchemaPSVIIDCNodePtr item)

{
  int iVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  int newSize;
  xmlSchemaPSVIIDCNodePtr *tmp;
  xmlSchemaPSVIIDCNodePtr item_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
    iVar1 = xmlGrowCapacity(vctxt->sizeIdcNodes,8,0x14,1000000000);
    if (iVar1 < 0) {
      xmlSchemaVErrMemory(vctxt);
      return -1;
    }
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(vctxt->idcNodes,(long)iVar1 << 3);
    if (ppxVar2 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory(vctxt);
      return -1;
    }
    vctxt->idcNodes = ppxVar2;
    vctxt->sizeIdcNodes = iVar1;
  }
  iVar1 = vctxt->nbIdcNodes;
  vctxt->nbIdcNodes = iVar1 + 1;
  vctxt->idcNodes[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,
			       xmlSchemaPSVIIDCNodePtr item)
{
    /*
    * Add to global list.
    */
    if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
        xmlSchemaPSVIIDCNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(vctxt->sizeIdcNodes, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}
	tmp = xmlRealloc(vctxt->idcNodes, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}

        vctxt->idcNodes = tmp;
        vctxt->sizeIdcNodes = newSize;
    }

    vctxt->idcNodes[vctxt->nbIdcNodes++] = item;
    return (0);
}